

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O1

void __thiscall
Js::JSONStringifier::AddToPropertyList
          (JSONStringifier *this,Var item,BVSparse<Memory::Recycler> *propertyBV)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  RecyclableObject *this_00;
  ulong uVar6;
  JavascriptString *propertyString;
  Type TVar7;
  undefined1 auStack_58 [8];
  PropertyListElement elem;
  PropertyRecord *propertyRecord;
  
  if (item == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) goto LAB_00b75072;
    *puVar5 = 0;
  }
  if (((ulong)item & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)item & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00b75072;
    *puVar5 = 0;
  }
  TVar7 = TypeIds_FirstNumberType;
  if ((((ulong)item & 0xffff000000000000) != 0x1000000000000) &&
     (TVar7 = TypeIds_Number, (ulong)item >> 0x32 == 0)) {
    this_00 = UnsafeVarTo<Js::RecyclableObject>(item);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar2) goto LAB_00b75072;
      *puVar5 = 0;
    }
    TVar7 = ((this_00->type).ptr)->typeId;
    if ((0x57 < (int)TVar7) && (BVar4 = RecyclableObject::IsExternal(this_00), BVar4 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar2) {
LAB_00b75072:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
  }
  propertyString = (JavascriptString *)0x0;
  if (TVar7 < TypeIds_BigIntObject) {
    uVar6 = (ulong)TVar7;
    if ((0xc000000070U >> (uVar6 & 0x3f) & 1) == 0) {
      if (uVar6 == 3) {
        propertyString = ScriptContext::GetIntegerString(this->scriptContext,item);
      }
      else if (uVar6 == 7) {
        propertyString = UnsafeVarTo<Js::JavascriptString>(item);
      }
    }
    else {
      propertyString = JavascriptConversion::ToString(item,this->scriptContext);
    }
  }
  if (propertyString != (JavascriptString *)0x0) {
    ScriptContext::GetOrAddPropertyRecord
              (this->scriptContext,propertyString,(PropertyRecord **)&elem.propertyName);
    BVar3 = BVSparse<Memory::Recycler>::TestAndSet
                      (propertyBV,
                       *(BVIndex *)&((elem.propertyName.ptr)->super_RecyclableObject).type.ptr);
    if (BVar3 == '\0') {
      auStack_58 = (undefined1  [8])0x0;
      elem.propertyRecord.ptr = (PropertyRecord *)0x0;
      Memory::Recycler::WBSetBit((char *)&elem);
      elem.propertyRecord.ptr = (PropertyRecord *)propertyString;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&elem);
      Memory::Recycler::WBSetBit((char *)auStack_58);
      auStack_58 = (undefined1  [8])elem.propertyName.ptr;
      Memory::RecyclerWriteBarrierManager::WriteBarrier((PropertyListElement *)auStack_58);
      SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>::Prepend
                (&this->propertyList->
                  super_SListBase<Js::JSONStringifier::PropertyListElement,_Memory::Recycler,_RealCount>
                 ,this->propertyList->allocator,(PropertyListElement *)auStack_58);
    }
  }
  return;
}

Assistant:

void
JSONStringifier::AddToPropertyList(_In_ Var item, _Inout_ BVSparse<Recycler>* propertyBV)
{
    JavascriptString* propertyName = nullptr;
    switch (JavascriptOperators::GetTypeId(item))
    {
    case TypeIds_Integer:
        propertyName = this->scriptContext->GetIntegerString(item);
        break;
    case TypeIds_String:
        propertyName = UnsafeVarTo<JavascriptString>(item);
        break;
    case TypeIds_Number:
    case TypeIds_NumberObject:
    case TypeIds_Int64Number:
    case TypeIds_UInt64Number:
    case TypeIds_StringObject:
        propertyName = JavascriptConversion::ToString(item, this->scriptContext);
        break;
    default:
        break;
    }

    if (propertyName != nullptr)
    {
        PropertyRecord const* propertyRecord;
        scriptContext->GetOrAddPropertyRecord(propertyName, &propertyRecord);
        if(!propertyBV->TestAndSet(propertyRecord->GetPropertyId()))
        {
            PropertyListElement elem;
            elem.propertyName = propertyName;
            elem.propertyRecord = propertyRecord;
            this->propertyList->Push(elem);
        }
    }
}